

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void uv__io_stop(uv_loop_t *loop,uv__io_t *w,uint events)

{
  void **ppvVar1;
  uint *puVar2;
  uint uVar3;
  long *plVar4;
  uv__io_t *puVar5;
  ulong uVar6;
  
  if ((events & 0xffffdffa) != 0) {
    __assert_fail("0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/core.c"
                  ,0x35e,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (events == 0) {
    __assert_fail("0 != events",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/core.c"
                  ,0x35f,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  uVar3 = w->fd;
  uVar6 = (ulong)uVar3;
  if (uVar6 != 0xffffffff) {
    if ((int)uVar3 < 0) {
      __assert_fail("w->fd >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/core.c"
                    ,0x364,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    if (uVar3 < loop->nwatchers) {
      ppvVar1 = w->watcher_queue;
      puVar2 = &w->pevents;
      *puVar2 = *puVar2 & ~events;
      if (*puVar2 == 0) {
        *(void **)w->watcher_queue[1] = w->watcher_queue[0];
        *(void **)((long)w->watcher_queue[0] + 8) = w->watcher_queue[1];
        w->watcher_queue[0] = ppvVar1;
        w->watcher_queue[1] = ppvVar1;
        puVar5 = loop->watchers[uVar6];
        if (puVar5 != (uv__io_t *)0x0) {
          if (puVar5 != w) {
            __assert_fail("loop->watchers[w->fd] == w",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/core.c"
                          ,0x371,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
          }
          uVar3 = loop->nfds;
          if (uVar3 == 0) {
            __assert_fail("loop->nfds > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/czanyou[P]node/deps/libuv/src/unix/core.c"
                          ,0x372,"void uv__io_stop(uv_loop_t *, uv__io_t *, unsigned int)");
          }
          loop->watchers[uVar6] = (uv__io_t *)0x0;
          loop->nfds = uVar3 - 1;
          w->events = 0;
        }
      }
      else if (ppvVar1 == (void **)w->watcher_queue[0]) {
        w->watcher_queue[0] = loop->watcher_queue;
        plVar4 = (long *)loop->watcher_queue[1];
        w->watcher_queue[1] = plVar4;
        *plVar4 = (long)ppvVar1;
        loop->watcher_queue[1] = ppvVar1;
      }
    }
  }
  return;
}

Assistant:

void uv__io_stop(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  assert(0 == (events & ~(POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI)));
  assert(0 != events);

  if (w->fd == -1)
    return;

  assert(w->fd >= 0);

  /* Happens when uv__io_stop() is called on a handle that was never started. */
  if ((unsigned) w->fd >= loop->nwatchers)
    return;

  w->pevents &= ~events;

  if (w->pevents == 0) {
    QUEUE_REMOVE(&w->watcher_queue);
    QUEUE_INIT(&w->watcher_queue);

    if (loop->watchers[w->fd] != NULL) {
      assert(loop->watchers[w->fd] == w);
      assert(loop->nfds > 0);
      loop->watchers[w->fd] = NULL;
      loop->nfds--;
      w->events = 0;
    }
  }
  else if (QUEUE_EMPTY(&w->watcher_queue))
    QUEUE_INSERT_TAIL(&loop->watcher_queue, &w->watcher_queue);
}